

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

char * ensureFilesExist(char *aDestination,char *aSourcePathsAndNames)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *aFilePathAndName;
  
  if ((aSourcePathsAndNames == (char *)0x0) || (*aSourcePathsAndNames == '\0')) {
    aDestination = (char *)0x0;
  }
  else {
    pcVar2 = strchr(aSourcePathsAndNames,0x7c);
    aFilePathAndName = aDestination;
    while (pcVar2 != (char *)0x0) {
      sVar3 = (long)pcVar2 - (long)aSourcePathsAndNames;
      memmove(aFilePathAndName,aSourcePathsAndNames,sVar3);
      aFilePathAndName[sVar3] = '\0';
      iVar1 = fileExists(aFilePathAndName);
      if (iVar1 != 0) {
        aFilePathAndName[sVar3] = '|';
        aFilePathAndName = aFilePathAndName + sVar3 + 1;
      }
      aSourcePathsAndNames = pcVar2 + 1;
      pcVar2 = strchr(aSourcePathsAndNames,0x7c);
    }
    iVar1 = fileExists(aSourcePathsAndNames);
    if (iVar1 == 0) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      sVar3 = strlen(aSourcePathsAndNames);
      memmove(aFilePathAndName,aSourcePathsAndNames,sVar3);
    }
    aFilePathAndName[sVar3] = '\0';
  }
  return aDestination;
}

Assistant:

static char * ensureFilesExist(char * aDestination,
        char const * aSourcePathsAndNames)
{
        char * lDestination = aDestination;
        char const * p;
        char const * p2;
        size_t lLen;

        if (!aSourcePathsAndNames)
        {
                return NULL;
        }
        lLen = strlen(aSourcePathsAndNames);
        if (!lLen)
        {
                return NULL;
        }

        p = aSourcePathsAndNames;
        while ((p2 = strchr(p, '|')) != NULL)
        {
                lLen = p2 - p;
                memmove(lDestination, p, lLen);
                lDestination[lLen] = '\0';
                if (fileExists(lDestination))
                {
                        lDestination += lLen;
                        *lDestination = '|';
                        lDestination++;
                }
                p = p2 + 1;
        }
        if (fileExists(p))
        {
                lLen = strlen(p);
                memmove(lDestination, p, lLen);
                lDestination[lLen] = '\0';
        }
        else
        {
                *(lDestination - 1) = '\0';
        }
        return aDestination;
}